

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeSetDeltaGammaMaxLSetup(void *cvode_mem,realtype dgmax_lsetup)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetDeltaGammaMaxLSetup",
                   "cvode_mem = NULL illegal.");
  }
  else {
    if (0.0 <= dgmax_lsetup) {
      *(realtype *)((long)cvode_mem + 0x418) = dgmax_lsetup;
    }
    else {
      *(undefined8 *)((long)cvode_mem + 0x418) = 0x3fd3333333333333;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetDeltaGammaMaxLSetup(void *cvode_mem, realtype dgmax_lsetup)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetDeltaGammaMaxLSetup",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* Set value or use default */
  if(dgmax_lsetup < ZERO)
    cv_mem->cv_dgmax_lsetup = DGMAX_LSETUP_DEFAULT;
  else
    cv_mem->cv_dgmax_lsetup = dgmax_lsetup;

  return(CV_SUCCESS);
}